

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_layout.cc
# Opt level: O0

vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *
upb::generator::SortedEnums
          (vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *__return_storage_ptr__,
          FileDefPtr file,WhichEnums which)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  MessageDefPtr message;
  iterator iVar4;
  iterator iVar5;
  int local_44;
  EnumDefPtr EStack_40;
  int i_1;
  EnumDefPtr local_38;
  EnumDefPtr top_level_enum;
  int i;
  FileDefPtr FStack_18;
  WhichEnums which_local;
  FileDefPtr file_local;
  vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *enums;
  
  FStack_18.ptr_ = file.ptr_;
  file_local.ptr_ = (upb_FileDef *)__return_storage_ptr__;
  std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::vector(__return_storage_ptr__);
  iVar2 = FileDefPtr::toplevel_enum_count(&stack0xffffffffffffffe8);
  std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::reserve
            (__return_storage_ptr__,(long)iVar2);
  for (top_level_enum.ptr_._0_4_ = 0; iVar2 = (int)top_level_enum.ptr_,
      iVar3 = FileDefPtr::toplevel_enum_count(&stack0xffffffffffffffe8), iVar2 < iVar3;
      top_level_enum.ptr_._0_4_ = (int)top_level_enum.ptr_ + 1) {
    local_38 = FileDefPtr::toplevel_enum(&stack0xffffffffffffffe8,(int)top_level_enum.ptr_);
    if ((which == kAllEnums) || (bVar1 = EnumDefPtr::is_closed(&local_38), bVar1)) {
      EStack_40 = FileDefPtr::toplevel_enum(&stack0xffffffffffffffe8,(int)top_level_enum.ptr_);
      std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::push_back
                (__return_storage_ptr__,&stack0xffffffffffffffc0);
    }
  }
  for (local_44 = 0; iVar2 = FileDefPtr::toplevel_message_count(&stack0xffffffffffffffe8),
      local_44 < iVar2; local_44 = local_44 + 1) {
    message = FileDefPtr::toplevel_message(&stack0xffffffffffffffe8,local_44);
    AddEnums(message,__return_storage_ptr__,which);
  }
  iVar4 = std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::begin
                    (__return_storage_ptr__);
  iVar5 = std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::end
                    (__return_storage_ptr__);
  std::
  sort<__gnu_cxx::__normal_iterator<upb::EnumDefPtr*,std::vector<upb::EnumDefPtr,std::allocator<upb::EnumDefPtr>>>,upb::generator::SortedEnums(upb::FileDefPtr,upb::generator::WhichEnums)::__0>
            (iVar4._M_current,iVar5._M_current);
  return __return_storage_ptr__;
}

Assistant:

std::vector<upb::EnumDefPtr> SortedEnums(upb::FileDefPtr file,
                                         WhichEnums which) {
  std::vector<upb::EnumDefPtr> enums;
  enums.reserve(file.toplevel_enum_count());
  for (int i = 0; i < file.toplevel_enum_count(); i++) {
    upb::EnumDefPtr top_level_enum = file.toplevel_enum(i);
    if (which == kAllEnums || top_level_enum.is_closed()) {
      enums.push_back(file.toplevel_enum(i));
    }
  }
  for (int i = 0; i < file.toplevel_message_count(); i++) {
    AddEnums(file.toplevel_message(i), &enums, which);
  }
  std::sort(enums.begin(), enums.end(),
            [](upb::EnumDefPtr a, upb::EnumDefPtr b) {
              return strcmp(a.full_name(), b.full_name()) < 0;
            });
  return enums;
}